

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

int Abc_SclCheckNtk(Abc_Ntk_t *p,int fVerbose)

{
  Abc_Obj_t *p_00;
  int iVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  long lVar4;
  int i;
  bool bVar5;
  
  Abc_NtkIncrementTravId(p);
  for (iVar3 = 0; iVar3 < p->vCis->nSize; iVar3 = iVar3 + 1) {
    pAVar2 = Abc_NtkCi(p,iVar3);
    Abc_NodeSetTravIdCurrent(pAVar2);
  }
  iVar3 = 1;
  i = 0;
  do {
    if (p->vObjs->nSize <= i) {
      if (fVerbose != 0 && iVar3 != 0) {
        puts("The network is in topo order and no dangling nodes.");
      }
      return iVar3;
    }
    pAVar2 = Abc_NtkObj(p,i);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
      for (lVar4 = 0; lVar4 < (pAVar2->vFanins).nSize; lVar4 = lVar4 + 1) {
        p_00 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar4]];
        iVar1 = Abc_NodeIsTravIdCurrent(p_00);
        if (iVar1 == 0) {
          iVar3 = 0;
          printf("obj %d and its fanin %d are not in the topo order\n",(ulong)(uint)pAVar2->Id,
                 (ulong)(uint)p_00->Id);
        }
      }
      Abc_NodeSetTravIdCurrent(pAVar2);
      if ((((pAVar2->pNtk->ntkFunc != ABC_FUNC_MAP) || ((*(uint *)&pAVar2->field_0x14 & 0xf) != 7))
          || ((pAVar2->vFanins).nSize != 1)) || ((pAVar2->field_5).pData != (void *)0x0)) {
        if ((pAVar2->vFanouts).nSize == 0) {
          printf("node %d has no fanout\n",(ulong)(uint)pAVar2->Id);
          return 0;
        }
        bVar5 = iVar3 == 0;
        iVar3 = 1;
        if (bVar5) {
          return 0;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Abc_SclCheckNtk( Abc_Ntk_t * p, int fVerbose )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k, fFlag = 1;
    Abc_NtkIncrementTravId( p );        
    Abc_NtkForEachCi( p, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );
    Abc_NtkForEachNode( p, pObj, i )
    {
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( !Abc_NodeIsTravIdCurrent( pFanin ) )
                printf( "obj %d and its fanin %d are not in the topo order\n", Abc_ObjId(pObj), Abc_ObjId(pFanin) ), fFlag = 0;
        Abc_NodeSetTravIdCurrent( pObj );
        if ( Abc_ObjIsBarBuf(pObj) )
            continue;
        if ( Abc_ObjFanoutNum(pObj) == 0 )
            printf( "node %d has no fanout\n", Abc_ObjId(pObj) ), fFlag = 0;
        if ( !fFlag )
            break;
    }
    if ( fFlag && fVerbose )
        printf( "The network is in topo order and no dangling nodes.\n" );
    return fFlag;
}